

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O2

bool __thiscall
google::protobuf::compiler::Parser::ParseDefaultAssignment
          (Parser *this,FieldDescriptorProto *field,LocationRecorder *field_location,
          FileDescriptorProto *containing_file)

{
  bool bVar1;
  string *output;
  AlphaNum *a;
  AlphaNum *a_00;
  char *pcVar2;
  io *this_00;
  AlphaNum *this_01;
  uint64_t max_value;
  uint64_t uVar3;
  string_view text;
  string_view text_00;
  string_view text_01;
  ErrorMaker error;
  string_view text_02;
  string_view text_03;
  string_view text_04;
  string_view text_05;
  string_view src;
  uint64_t value;
  double value_1;
  AlphaNum local_68;
  LocationRecorder location;
  
  if ((undefined1  [80])((undefined1  [80])field->field_0 & (undefined1  [80])0x8) !=
      (undefined1  [80])0x0) {
    RecordError(this,(ErrorMaker)ZEXT816(0x57d533));
    FieldDescriptorProto::clear_default_value(field);
  }
  text._M_str = "default";
  text._M_len = 7;
  bVar1 = Consume(this,text);
  if ((!bVar1) || (text_00._M_str = "=", text_00._M_len = 1, bVar1 = Consume(this,text_00), !bVar1))
  {
    return false;
  }
  LocationRecorder::LocationRecorder(&location,field_location,7);
  LocationRecorder::RecordLegacyLocation(&location,&field->super_Message,DEFAULT_VALUE);
  output = FieldDescriptorProto::_internal_mutable_default_value_abi_cxx11_(field);
  if ((undefined1  [80])((undefined1  [80])field->field_0 & (undefined1  [80])0x400) ==
      (undefined1  [80])0x0) {
    std::__cxx11::string::_M_assign((string *)output);
    bVar1 = true;
    io::Tokenizer::Next(this->input_);
    goto LAB_002c119b;
  }
  switch((field->field_0)._impl_.type_) {
  case 1:
  case 2:
    text_02._M_str = "-";
    text_02._M_len = 1;
    bVar1 = TryConsume(this,text_02);
    if (bVar1) {
      std::__cxx11::string::append((char *)output);
    }
    this_00 = (io *)&value_1;
    value_1 = 0.0;
    bVar1 = ConsumeNumber(this,(double *)this_00,(ErrorMaker)ZEXT816(0x57d5ad));
    if (bVar1) {
      io::SimpleDtoa_abi_cxx11_((string *)&local_68,this_00,value_1);
      std::__cxx11::string::append((string *)output);
      this_01 = &local_68;
      goto LAB_002c10d7;
    }
    goto LAB_002c1199;
  case 3:
  case 0x10:
  case 0x12:
    uVar3 = 0x7fffffffffffffff;
    goto LAB_002c0f52;
  case 4:
  case 6:
    uVar3 = 0xffffffffffffffff;
    goto LAB_002c105e;
  case 5:
  case 0xf:
  case 0x11:
    uVar3 = 0x7fffffff;
LAB_002c0f52:
    text_01._M_str = "-";
    text_01._M_len = 1;
    bVar1 = TryConsume(this,text_01);
    if (bVar1) {
      std::__cxx11::string::append((char *)output);
      uVar3 = uVar3 + 1;
    }
    bVar1 = ConsumeInteger64(this,uVar3,&value,(ErrorMaker)ZEXT816(0x57d551));
    if (!bVar1) {
LAB_002c1199:
      bVar1 = false;
      goto LAB_002c119b;
    }
    absl::lts_20250127::AlphaNum::AlphaNum(&local_68,value);
    absl::lts_20250127::StrCat_abi_cxx11_((string *)&value_1,(lts_20250127 *)&local_68,a);
    std::__cxx11::string::append((string *)output);
LAB_002c10d2:
    this_01 = (AlphaNum *)&value_1;
LAB_002c10d7:
    std::__cxx11::string::~string((string *)this_01);
    break;
  case 7:
  case 0xd:
    uVar3 = 0xffffffff;
LAB_002c105e:
    text_03._M_str = "-";
    text_03._M_len = 1;
    bVar1 = TryConsume(this,text_03);
    if (bVar1) {
      RecordError(this,(ErrorMaker)ZEXT816(0x57d57b));
    }
    bVar1 = ConsumeInteger64(this,uVar3,&value,(ErrorMaker)ZEXT816(0x57d551));
    if (bVar1) {
      absl::lts_20250127::AlphaNum::AlphaNum(&local_68,value);
      absl::lts_20250127::StrCat_abi_cxx11_((string *)&value_1,(lts_20250127 *)&local_68,a_00);
      std::__cxx11::string::append((string *)output);
      goto LAB_002c10d2;
    }
    goto LAB_002c1199;
  case 8:
    text_04._M_str = "true";
    text_04._M_len = 4;
    bVar1 = TryConsume(this,text_04);
    if ((!bVar1) &&
       (text_05._M_str = "false", text_05._M_len = 5, bVar1 = TryConsume(this,text_05), !bVar1)) {
      pcVar2 = "Expected \"true\" or \"false\".";
      goto LAB_002c0fdc;
    }
    std::__cxx11::string::assign((char *)output);
    break;
  case 9:
    bVar1 = ConsumeString(this,output,(ErrorMaker)ZEXT816(0x57d5da));
    goto LAB_002c1191;
  case 10:
  case 0xb:
    pcVar2 = "Messages can\'t have default values.";
LAB_002c0fdc:
    bVar1 = false;
    error.func_ = (_func_string_void_ptr *)0x0;
    error.field_0.error_ = pcVar2;
    RecordError(this,error);
    goto LAB_002c119b;
  case 0xc:
    pcVar2 = (char *)0x0;
    bVar1 = ConsumeString(this,output,(ErrorMaker)ZEXT816(0x57d603));
    if (!bVar1) goto LAB_002c1199;
    src._M_str = pcVar2;
    src._M_len = (size_t)(output->_M_dataplus)._M_p;
    absl::lts_20250127::CEscape_abi_cxx11_
              ((string *)&local_68,(lts_20250127 *)output->_M_string_length,src);
    this_01 = &local_68;
    std::__cxx11::string::operator=((string *)output,(string *)this_01);
    goto LAB_002c10d7;
  case 0xe:
    bVar1 = ConsumeIdentifier(this,output,(ErrorMaker)ZEXT816(0x57d614));
LAB_002c1191:
    if (bVar1 != false) break;
    goto LAB_002c1199;
  }
  bVar1 = true;
LAB_002c119b:
  LocationRecorder::~LocationRecorder(&location);
  return bVar1;
}

Assistant:

bool Parser::ParseDefaultAssignment(
    FieldDescriptorProto* field, const LocationRecorder& field_location,
    const FileDescriptorProto* containing_file) {
  if (field->has_default_value()) {
    RecordError("Already set option \"default\".");
    field->clear_default_value();
  }

  DO(Consume("default"));
  DO(Consume("="));

  LocationRecorder location(field_location,
                            FieldDescriptorProto::kDefaultValueFieldNumber);
  location.RecordLegacyLocation(field,
                                DescriptorPool::ErrorCollector::DEFAULT_VALUE);
  std::string* default_value = field->mutable_default_value();

  if (!field->has_type()) {
    // The field has a type name, but we don't know if it is a message or an
    // enum yet. (If it were a primitive type, |field| would have a type set
    // already.) In this case, simply take the current string as the default
    // value; we will catch the error later if it is not a valid enum value.
    // (N.B. that we do not check whether the current token is an identifier:
    // doing so throws strange errors when the user mistypes a primitive
    // typename and we assume it's an enum. E.g.: "optional int foo = 1 [default
    // = 42]". In such a case the fundamental error is really that "int" is not
    // a type, not that "42" is not an identifier. See b/12533582.)
    *default_value = input_->current().text;
    input_->Next();
    return true;
  }

  switch (field->type()) {
    case FieldDescriptorProto::TYPE_INT32:
    case FieldDescriptorProto::TYPE_INT64:
    case FieldDescriptorProto::TYPE_SINT32:
    case FieldDescriptorProto::TYPE_SINT64:
    case FieldDescriptorProto::TYPE_SFIXED32:
    case FieldDescriptorProto::TYPE_SFIXED64: {
      uint64_t max_value = std::numeric_limits<int64_t>::max();
      if (field->type() == FieldDescriptorProto::TYPE_INT32 ||
          field->type() == FieldDescriptorProto::TYPE_SINT32 ||
          field->type() == FieldDescriptorProto::TYPE_SFIXED32) {
        max_value = std::numeric_limits<int32_t>::max();
      }

      // These types can be negative.
      if (TryConsume("-")) {
        default_value->append("-");
        // Two's complement always has one more negative value than positive.
        ++max_value;
      }
      // Parse the integer to verify that it is not out-of-range.
      uint64_t value;
      DO(ConsumeInteger64(max_value, &value,
                          "Expected integer for field default value."));
      // And stringify it again.
      default_value->append(absl::StrCat(value));
      break;
    }

    case FieldDescriptorProto::TYPE_UINT32:
    case FieldDescriptorProto::TYPE_UINT64:
    case FieldDescriptorProto::TYPE_FIXED32:
    case FieldDescriptorProto::TYPE_FIXED64: {
      uint64_t max_value = std::numeric_limits<uint64_t>::max();
      if (field->type() == FieldDescriptorProto::TYPE_UINT32 ||
          field->type() == FieldDescriptorProto::TYPE_FIXED32) {
        max_value = std::numeric_limits<uint32_t>::max();
      }

      // Numeric, not negative.
      if (TryConsume("-")) {
        RecordError("Unsigned field can't have negative default value.");
      }
      // Parse the integer to verify that it is not out-of-range.
      uint64_t value;
      DO(ConsumeInteger64(max_value, &value,
                          "Expected integer for field default value."));
      // And stringify it again.
      default_value->append(absl::StrCat(value));
      break;
    }

    case FieldDescriptorProto::TYPE_FLOAT:
    case FieldDescriptorProto::TYPE_DOUBLE: {
      // These types can be negative.
      if (TryConsume("-")) {
        default_value->append("-");
      }
      // Parse the integer because we have to convert hex integers to decimal
      // floats.
      double value = 0.0;
      DO(ConsumeNumber(&value, "Expected number."));
      // And stringify it again.
      default_value->append(io::SimpleDtoa(value));
      break;
    }
    case FieldDescriptorProto::TYPE_BOOL:
      if (TryConsume("true")) {
        default_value->assign("true");
      } else if (TryConsume("false")) {
        default_value->assign("false");
      } else {
        RecordError("Expected \"true\" or \"false\".");
        return false;
      }
      break;

    case FieldDescriptorProto::TYPE_STRING:
      // Note: When file option java_string_check_utf8 is true, if a
      // non-string representation (eg byte[]) is later supported, it must
      // be checked for UTF-8-ness.
      DO(ConsumeString(default_value,
                       "Expected string for field default "
                       "value."));
      break;

    case FieldDescriptorProto::TYPE_BYTES:
      DO(ConsumeString(default_value, "Expected string."));
      *default_value = absl::CEscape(*default_value);
      break;

    case FieldDescriptorProto::TYPE_ENUM:
      DO(ConsumeIdentifier(default_value,
                           "Expected enum identifier for field "
                           "default value."));
      break;

    case FieldDescriptorProto::TYPE_MESSAGE:
    case FieldDescriptorProto::TYPE_GROUP:
      RecordError("Messages can't have default values.");
      return false;
  }

  return true;
}